

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O2

riff * riff_parse(DUMBFILE *f,int32 offset,int32 size,uint proper)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  riff *stream;
  riff_chunk *__ptr;
  riff *prVar6;
  ulong uVar7;
  riff_chunk *prVar8;
  
  if (7 < size) {
    iVar1 = dumbfile_seek(f,(long)offset,0);
    if (iVar1 != 0) {
      return (riff *)0x0;
    }
    iVar2 = dumbfile_mgetl(f);
    if ((iVar2 == 0x52494646) && (uVar3 = dumbfile_igetl(f), 3 < uVar3 && uVar3 + 8 <= (uint)size))
    {
      stream = (riff *)malloc(0x10);
      if (stream != (riff *)0x0) {
        uVar4 = dumbfile_mgetl(f);
        stream->type = uVar4;
        stream->chunk_count = 0;
        stream->chunks = (riff_chunk *)0x0;
        uVar3 = uVar3 - 4;
        __ptr = (riff_chunk *)0x0;
        uVar7 = 0;
        while( true ) {
          if (uVar3 == 0) {
            return stream;
          }
          iVar1 = dumbfile_error(f);
          if ((iVar1 != 0) || (uVar3 < 8)) break;
          uVar4 = (int)uVar7 + 1;
          __ptr = (riff_chunk *)realloc(__ptr,(ulong)uVar4 * 0x18);
          stream->chunks = __ptr;
          if (__ptr == (riff_chunk *)0x0) break;
          uVar5 = dumbfile_mgetl(f);
          __ptr[uVar7].type = uVar5;
          uVar5 = dumbfile_igetl(f);
          __ptr[uVar7].size = uVar5;
          iVar1 = dumbfile_pos(f);
          __ptr[uVar7].offset = iVar1;
          uVar3 = uVar3 - 8;
          uVar5 = __ptr[uVar7].size;
          if (uVar3 < uVar5) {
LAB_0064dc26:
            if (uVar3 == 0) {
              return stream;
            }
            break;
          }
          prVar8 = __ptr + uVar7;
          if (prVar8->type == 0x52494646) {
            prVar6 = riff_parse(f,iVar1 + -8,uVar5 + 8,proper);
            prVar8->nested = prVar6;
            if (prVar6 == (riff *)0x0) goto LAB_0064dc26;
            iVar1 = prVar8->offset;
            uVar5 = prVar8->size;
          }
          else {
            prVar8->nested = (riff *)0x0;
          }
          dumbfile_seek(f,(ulong)(uVar5 + iVar1),0);
          uVar3 = uVar3 - prVar8->size;
          if ((proper != 0) && ((prVar8->size & 1) != 0)) {
            dumbfile_skip(f,1);
            uVar3 = uVar3 - 1;
          }
          stream->chunk_count = uVar4;
          uVar7 = (ulong)uVar4;
        }
        riff_free(stream);
      }
    }
  }
  return (riff *)0x0;
}

Assistant:

struct riff * riff_parse( DUMBFILE * f, int32 offset, int32 size, unsigned proper )
{
	unsigned stream_size;
	struct riff * stream;


    if ( size < 8 ) return 0;

    if ( dumbfile_seek(f, offset, DFS_SEEK_SET) ) return 0;
    if ( dumbfile_mgetl(f) != DUMB_ID('R','I','F','F') ) return 0;

    stream_size = dumbfile_igetl(f);
    if ( stream_size + 8 > (unsigned)size ) return 0;
	if ( stream_size < 4 ) return 0;

    stream = (struct riff *) malloc( sizeof( struct riff ) );
	if ( ! stream ) return 0;

    stream->type = dumbfile_mgetl(f);
	stream->chunk_count = 0;
	stream->chunks = 0;

	stream_size -= 4;

    while ( stream_size && !dumbfile_error(f) )
	{
		struct riff_chunk * chunk;
		if ( stream_size < 8 ) break;
        stream->chunks = ( struct riff_chunk * ) realloc( stream->chunks, ( stream->chunk_count + 1 ) * sizeof( struct riff_chunk ) );
		if ( ! stream->chunks ) break;
		chunk = stream->chunks + stream->chunk_count;
        chunk->type = dumbfile_mgetl(f);
        chunk->size = dumbfile_igetl(f);
        chunk->offset = dumbfile_pos(f);
		stream_size -= 8;
		if ( stream_size < chunk->size ) break;
        if ( chunk->type == DUMB_ID('R','I','F','F') )
		{
            chunk->nested = riff_parse( f, chunk->offset - 8, chunk->size + 8, proper );
            if ( ! chunk->nested ) break;
		}
		else
		{
            chunk->nested = 0;
		}
        dumbfile_seek(f, chunk->offset + chunk->size, DFS_SEEK_SET);
		stream_size -= chunk->size;
		if ( proper && ( chunk->size & 1 ) )
		{
            dumbfile_skip(f, 1);
			-- stream_size;
		}
		++stream->chunk_count;
	}
	
	if ( stream_size )
	{
		riff_free( stream );
		stream = 0;
	}

	return stream;
}